

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O0

fdb_status
fdb_log_impl(err_log_callback *log_callback,fdb_log_levels given_log_level,fdb_status status,
            char *source_file,char *func_name,size_t line_number,char *format,...)

{
  char in_AL;
  char *in_RCX;
  fdb_status in_EDX;
  ulong in_RSI;
  long *in_RDI;
  char *in_R8;
  size_t in_R9;
  size_t in_XMM0_Qa;
  char *in_XMM0_Qb;
  char *in_stack_00000008;
  char log_abbr [7] [8];
  char ISO_time_buffer [64];
  va_list args;
  char msg [4096];
  size_t cur_log_level;
  undefined1 local_1198 [48];
  size_t in_stack_ffffffffffffee98;
  char *in_stack_ffffffffffffeea0;
  undefined1 local_10e8 [64];
  undefined1 local_10a8 [64];
  undefined4 local_1068;
  undefined4 local_1064;
  undefined1 *local_1060;
  undefined1 *local_1058;
  char local_1048 [4104];
  ulong local_40;
  size_t local_38;
  char *local_30;
  char *local_28;
  fdb_status local_1c;
  ulong local_18;
  long *local_10;
  fdb_status local_4;
  
  if (in_AL != '\0') {
    in_stack_ffffffffffffee98 = in_XMM0_Qa;
    in_stack_ffffffffffffeea0 = in_XMM0_Qb;
  }
  local_4 = in_EDX;
  if (in_RSI <= global_log_config.log_msg_level) {
    local_1058 = local_1198;
    local_1060 = &stack0x00000010;
    local_1064 = 0x30;
    local_1068 = 0x30;
    local_40 = in_RSI;
    local_38 = in_R9;
    local_30 = in_R8;
    local_28 = in_RCX;
    local_1c = in_EDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    vsnprintf(local_1048,0xfff,in_stack_00000008,&local_1068);
    if ((local_10 == (long *)0x0) || (local_10[1] == 0)) {
      if ((local_10 == (long *)0x0) || (*local_10 == 0)) {
        if (global_log_cb.callback_ex == (fdb_log_callback_ex)0x0) {
          memcpy(local_10e8,&DAT_00181610,0x38);
          printISOTime(in_stack_ffffffffffffeea0,in_stack_ffffffffffffee98);
          if (local_1c == FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"%s [%s][FDB] %s\n",local_10a8,local_10e8 + local_40 * 8,local_1048);
          }
          else {
            fprintf(_stderr,"%s [%s][FDB] %s\n",local_10a8,local_10e8 + local_40 * 8,local_1048);
          }
          local_4 = local_1c;
        }
        else {
          (*global_log_cb.callback_ex)
                    ((int)local_40,local_1c,local_28,local_30,local_38,local_1048,
                     global_log_cb.ctx_data);
          local_4 = local_1c;
        }
      }
      else {
        (*(code *)*local_10)(local_1c,local_1048,local_10[2]);
        local_4 = local_1c;
      }
    }
    else {
      (*(code *)local_10[1])
                (local_40 & 0xffffffff,local_1c,local_28,local_30,local_38,local_1048,local_10[2]);
      local_4 = local_1c;
    }
  }
  return local_4;
}

Assistant:

fdb_status fdb_log_impl(err_log_callback* log_callback,
                        fdb_log_levels given_log_level,
                        fdb_status status,
                        const char* source_file,
                        const char* func_name,
                        size_t line_number,
                        const char *format, ...)
{
    // 1: Fatal   [FATL]
    // 2: Error   [ERRO]
    // 3: Warning [WARN]
    // 4: Info    [INFO]
    // 5: Debug   [DEBG]
    // 6: Trace   [TRAC]
    size_t cur_log_level = given_log_level;

    if (global_log_config.log_msg_level < cur_log_level) {
        // Configuration doesn't allow to print out
        // log message of this level.
        return status;
    }

    char msg[4096];
    va_list args;
    va_start(args, format);
    vsnprintf(msg, 4095, format, args);
    va_end(args);

    if (log_callback && log_callback->callback_ex) {
        // If extended callback exist, use it.
        log_callback->callback_ex
        ( cur_log_level, status, source_file, func_name, line_number,
          msg, log_callback->ctx_data );
        return status;

    } else if (log_callback && log_callback->callback) {
        // Normal callback.
        log_callback->callback(status, msg, log_callback->ctx_data);
        return status;

    } else if (global_log_cb.callback_ex) {
        // Global log callback is given.
        global_log_cb.callback_ex
        ( cur_log_level, status, source_file, func_name, line_number,
          msg, global_log_cb.ctx_data );
        return status;
    }

    // Callback is not given.
    char ISO_time_buffer[64];
    char log_abbr[7][8] = {"XXXX", "FATL", "ERRO", "WARN",
                           "INFO", "DEBG", "TRAC"};
    printISOTime(ISO_time_buffer, 64);
    if (status != FDB_RESULT_SUCCESS) {
        fprintf(stderr, "%s [%s][FDB] %s\n",
                ISO_time_buffer, log_abbr[cur_log_level], msg);
    } else {
        fprintf(stderr, "%s [%s][FDB] %s\n",
                ISO_time_buffer, log_abbr[cur_log_level], msg);
    }
    return status;
}